

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

__int_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_key_prefix_splits
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

[[nodiscard]] auto get_key_prefix_splits() const noexcept {
    return key_prefix_splits.load(std::memory_order_relaxed);
  }